

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

bool argparse::Argument::is_decimal_literal(string_view s)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  byte *pbVar4;
  char *pcVar5;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  anon_class_1_1_ee830756 consume_digits;
  anon_class_1_1_ee830756 local_1;
  
  pbVar4 = (byte *)s._M_str;
  sVar3 = s._M_len;
  if (sVar3 == 0) {
    return false;
  }
  bVar1 = *pbVar4;
  if (bVar1 - 0x31 < 9) {
    bVar6 = is_decimal_literal::anon_class_1_1_ee830756::operator()(&local_1,s);
    if (bVar6._M_len == 0) {
      return true;
    }
LAB_0010a60e:
    pcVar5 = bVar6._M_str;
    cVar2 = *pcVar5;
    if ((cVar2 == 'e') || (cVar2 == 'E')) goto LAB_0010a6b6;
    if (cVar2 != '.') {
      return false;
    }
    sVar3 = bVar6._M_len - 1;
    if (sVar3 == 0) {
      return true;
    }
    pbVar4 = (byte *)(pcVar5 + 1);
    bVar1 = pcVar5[1];
    bVar6._M_str = (char *)pbVar4;
    bVar6._M_len = sVar3;
    if (bVar1 - 0x30 < 10) goto LAB_0010a692;
  }
  else {
    if (bVar1 != 0x2e) {
      if (bVar1 != 0x30) {
        return false;
      }
      if (sVar3 - 1 == 0) {
        return true;
      }
      s_00._M_str = (char *)(pbVar4 + 1);
      s_00._M_len = sVar3 - 1;
      bVar6 = is_decimal_literal::anon_class_1_1_ee830756::operator()(&local_1,s_00);
      if (bVar6._M_len == 0) {
        return false;
      }
      goto LAB_0010a60e;
    }
    sVar3 = sVar3 - 1;
    if (sVar3 == 0) {
      return false;
    }
    if (9 < pbVar4[1] - 0x30) {
      return false;
    }
    pbVar4 = pbVar4 + 1;
LAB_0010a692:
    s_01._M_str = (char *)pbVar4;
    s_01._M_len = sVar3;
    bVar6 = is_decimal_literal::anon_class_1_1_ee830756::operator()(&local_1,s_01);
    if (bVar6._M_len == 0) {
      return true;
    }
    bVar1 = *bVar6._M_str;
  }
  if ((bVar1 | 0x20) != 0x65) {
    return false;
  }
LAB_0010a6b6:
  pcVar5 = bVar6._M_str;
  sVar3 = bVar6._M_len - 1;
  if (sVar3 != 0) {
    bVar1 = pcVar5[1];
    if ((bVar1 == 0x2d) || (bVar1 == 0x2b)) {
      sVar3 = bVar6._M_len - 2;
      if (sVar3 == 0) {
        return false;
      }
      bVar1 = pcVar5[2];
      pcVar5 = pcVar5 + 2;
    }
    else {
      pcVar5 = pcVar5 + 1;
    }
    if (bVar1 - 0x30 < 10) {
      s_02._M_str = pcVar5;
      s_02._M_len = sVar3;
      bVar6 = is_decimal_literal::anon_class_1_1_ee830756::operator()(&local_1,s_02);
      return bVar6._M_len == 0;
    }
  }
  return false;
}

Assistant:

static bool is_decimal_literal(std::string_view s) {
    auto is_digit = [](auto c) constexpr {
      switch (c) {
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return true;
      default:
        return false;
      }
    };

    // precondition: we have consumed or will consume at least one digit
    auto consume_digits = [=](std::string_view s) {
      auto it = std::find_if_not(begin(s), end(s), is_digit);
      return s.substr(it - begin(s));
    };

    switch (lookahead(s)) {
    case '0': {
      s.remove_prefix(1);
      if (s.empty())
        return true;
      else
        goto integer_part;
    }
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9': {
      s = consume_digits(s);
      if (s.empty())
        return true;
      else
        goto integer_part_consumed;
    }
    case '.': {
      s.remove_prefix(1);
      goto post_decimal_point;
    }
    default:
      return false;
    }

  integer_part:
    s = consume_digits(s);
  integer_part_consumed:
    switch (lookahead(s)) {
    case '.': {
      s.remove_prefix(1);
      if (is_digit(lookahead(s)))
        goto post_decimal_point;
      else
        goto exponent_part_opt;
    }
    case 'e':
    case 'E': {
      s.remove_prefix(1);
      goto post_e;
    }
    default:
      return false;
    }

  post_decimal_point:
    if (is_digit(lookahead(s))) {
      s = consume_digits(s);
      goto exponent_part_opt;
    } else {
      return false;
    }

  exponent_part_opt:
    switch (lookahead(s)) {
    case eof:
      return true;
    case 'e':
    case 'E': {
      s.remove_prefix(1);
      goto post_e;
    }
    default:
      return false;
    }

  post_e:
    switch (lookahead(s)) {
    case '-':
    case '+':
      s.remove_prefix(1);
    }
    if (is_digit(lookahead(s))) {
      s = consume_digits(s);
      return s.empty();
    } else {
      return false;
    }
  }